

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checkbox.cpp
# Opt level: O3

void __thiscall cursespp::Checkbox::Checkbox(Checkbox *this)

{
  connections_list *pcVar1;
  
  TextLabel::TextLabel(&this->super_TextLabel);
  (this->super_TextLabel).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__Checkbox_001a3fd0;
  (this->super_TextLabel).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__Checkbox_001a41f0;
  (this->super_TextLabel).super_Window.super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__Checkbox_001a4220;
  (this->super_TextLabel).super_Window.super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__Checkbox_001a4248;
  (this->super_TextLabel).super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__Checkbox_001a4270;
  (this->CheckChanged).
  super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a3f28;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->CheckChanged).
                      super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>
                      .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
                      m_mutex,(pthread_mutexattr_t *)0x0);
  pcVar1 = &(this->CheckChanged).
            super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.
            m_connected_slots;
  *(connections_list **)
   ((long)&(this->CheckChanged).
           super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.
           m_connected_slots.
           super__List_base<sigslot::_connection_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>_*>_>
           ._M_impl._M_node.super__List_node_base + 8) = pcVar1;
  (this->CheckChanged).
  super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pcVar1;
  (this->CheckChanged).
  super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->CheckChanged).
  super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal2_001a4388;
  this->checked = false;
  (this->originalText)._M_dataplus._M_p = (pointer)&(this->originalText).field_2;
  (this->originalText)._M_string_length = 0;
  (this->originalText).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Checkbox::Checkbox()
: TextLabel()
, checked(false) {
}